

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall amrex::EB2::Level::fillBndryNorm(Level *this,MultiFab *bndrynorm,Geometry *geom)

{
  int dst_nghost;
  int num_comp;
  Periodicity local_38;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&bndrynorm->super_FabArray<amrex::FArrayBox>,0.0);
  if (this->m_allregular == false) {
    dst_nghost = (bndrynorm->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    num_comp = (bndrynorm->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    local_38 = Geometry::periodicity(geom);
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&bndrynorm->super_FabArray<amrex::FArrayBox>,
               &(this->m_bndrynorm).super_FabArray<amrex::FArrayBox>,0,0,num_comp,0,dst_nghost,
               &local_38,COPY);
  }
  return;
}

Assistant:

void
Level::fillBndryNorm (   MultiFab& bndrynorm, const Geometry& geom) const
{
    bndrynorm.setVal(0.0);
    if (!isAllRegular()) {
        bndrynorm.ParallelCopy(m_bndrynorm,0,0,bndrynorm.nComp(),0,bndrynorm.nGrow(),
                               geom.periodicity());
    }
}